

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_certificate.cc
# Opt level: O2

bool __thiscall
bssl::ParseTbsCertificate
          (bssl *this,Input tbs_tlv,ParseCertificateOptions *options,ParsedTbsCertificate *out,
          CertErrors *errors)

{
  bool bVar1;
  Input *pIVar2;
  GeneralizedTime *not_before;
  size_t extraout_RDX;
  char *pcVar3;
  ParsedTbsCertificate *not_after;
  Input input;
  Input value;
  Input validity_tlv_00;
  Input input_00;
  Input in;
  Input in_00;
  Parser tbs_parser;
  Parser parser_1;
  undefined8 uStack_c8;
  optional<bssl::der::Input> issuer_unique_id;
  Input validity_tlv;
  optional<bssl::der::Input> subject_unique_id;
  optional<bssl::der::Input> version;
  Parser parser;
  CertErrors unused_errors;
  
  not_after = out;
  CertErrors::CertErrors(&unused_errors);
  if (out == (ParsedTbsCertificate *)0x0) {
    out = (ParsedTbsCertificate *)&unused_errors;
  }
  input.data_.size_ = (size_t)tbs_tlv.data_.data_;
  input.data_.data_ = (uchar *)this;
  der::Parser::Parser(&parser,input);
  der::Parser::Parser(&tbs_parser);
  bVar1 = der::Parser::ReadSequence(&parser,&tbs_parser);
  if (bVar1) {
    version.super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
    super__Optional_payload_base<bssl::der::Input>._M_engaged = false;
    bVar1 = der::Parser::ReadOptionalTag(&tbs_parser,0xa0000000,&version);
    if (bVar1) {
      if (version.super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
          super__Optional_payload_base<bssl::der::Input>._M_engaged == true) {
        der::Parser::Parser(&parser_1,
                            version.super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
                            super__Optional_payload_base<bssl::der::Input>._M_payload._M_value.data_
                           );
        bVar1 = der::Parser::ReadUint64(&parser_1,(uint64_t *)&issuer_unique_id);
        if ((bVar1) &&
           (issuer_unique_id.super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
            super__Optional_payload_base<bssl::der::Input>._M_payload._M_value.data_.data_ <
            (uchar *)0x3)) {
          *(int *)options =
               (int)issuer_unique_id.super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
                    super__Optional_payload_base<bssl::der::Input>._M_payload._M_value.data_.data_;
          bVar1 = der::Parser::HasMore(&parser_1);
          if (!bVar1) {
            if (*(int *)options == 0) {
              pcVar3 = "Version explicitly V1 (should be omitted)";
              goto LAB_0037d321;
            }
            goto LAB_0037d0e8;
          }
        }
        pcVar3 = "Failed parsing version";
      }
      else {
        *(undefined4 *)options = 0;
LAB_0037d0e8:
        bVar1 = der::Parser::ReadTag(&tbs_parser,2,(Input *)(options + 8));
        if (bVar1) {
          value.data_.size_._0_1_ = *(char *)tbs_tlv.data_.size_;
          value.data_.data_ = (uchar *)*(undefined8 *)(options + 0x10);
          value.data_.size_._1_7_ = 0;
          bVar1 = VerifySerialNumber(*(bssl **)(options + 8),value,SUB81(out,0),
                                     (CertErrors *)not_after);
          if ((!bVar1) && (*(char *)tbs_tlv.data_.size_ != '\x01')) goto LAB_0037d329;
          bVar1 = anon_unknown_0::ReadSequenceTLV(&tbs_parser,(Input *)(options + 0x18));
          if (bVar1) {
            bVar1 = anon_unknown_0::ReadSequenceTLV(&tbs_parser,(Input *)(options + 0x28));
            if (bVar1) {
              validity_tlv.data_.data_ = (uchar *)0x0;
              validity_tlv.data_.size_ = 0;
              bVar1 = der::Parser::ReadRawTLV(&tbs_parser,&validity_tlv);
              if (bVar1) {
                not_before = (GeneralizedTime *)(options + 0x40);
                validity_tlv_00.data_.size_ = (size_t)(options + 0x38);
                validity_tlv_00.data_.data_ = (uchar *)validity_tlv.data_.size_;
                bVar1 = ParseValidity((bssl *)validity_tlv.data_.data_,validity_tlv_00,not_before,
                                      (GeneralizedTime *)not_after);
                if (bVar1) {
                  bVar1 = anon_unknown_0::ReadSequenceTLV(&tbs_parser,(Input *)(options + 0x48));
                  if (bVar1) {
                    bVar1 = anon_unknown_0::ReadSequenceTLV(&tbs_parser,(Input *)(options + 0x58));
                    if (bVar1) {
                      issuer_unique_id.super__Optional_base<bssl::der::Input,_true,_true>._M_payload
                      .super__Optional_payload_base<bssl::der::Input>._M_engaged = false;
                      bVar1 = der::Parser::ReadOptionalTag(&tbs_parser,0x80000001,&issuer_unique_id)
                      ;
                      if (bVar1) {
                        if (issuer_unique_id.super__Optional_base<bssl::der::Input,_true,_true>.
                            _M_payload.super__Optional_payload_base<bssl::der::Input>._M_engaged !=
                            true) {
LAB_0037d214:
                          subject_unique_id.super__Optional_base<bssl::der::Input,_true,_true>.
                          _M_payload.super__Optional_payload_base<bssl::der::Input>._M_engaged =
                               false;
                          bVar1 = der::Parser::ReadOptionalTag
                                            (&tbs_parser,0x80000002,&subject_unique_id);
                          if (bVar1) {
                            if (subject_unique_id.super__Optional_base<bssl::der::Input,_true,_true>
                                ._M_payload.super__Optional_payload_base<bssl::der::Input>.
                                _M_engaged == true) {
                              in_00.data_.size_ = (size_t)not_before;
                              in_00.data_.data_ =
                                   (uchar *)subject_unique_id.
                                            super__Optional_base<bssl::der::Input,_true,_true>.
                                            _M_payload.
                                            super__Optional_payload_base<bssl::der::Input>.
                                            _M_payload._M_value.data_.size_;
                              der::ParseBitString((optional<bssl::der::BitString> *)&parser_1,
                                                  (der *)subject_unique_id.
                                                                                                                  
                                                  super__Optional_base<bssl::der::Input,_true,_true>
                                                  ._M_payload.
                                                  super__Optional_payload_base<bssl::der::Input>.
                                                  _M_payload._M_value.data_.data_,in_00);
                              *(size_t *)(options + 0x98) = parser_1.advance_len_;
                              *(undefined8 *)(options + 0xa0) = uStack_c8;
                              *(uint8_t **)(options + 0x88) = parser_1.cbs_.data;
                              *(size_t *)(options + 0x90) = parser_1.cbs_.len;
                              if (options[0xa0].allow_invalid_serial_numbers == false) {
                                pcVar3 = "Failed parsing subjectUniqueId";
                              }
                              else {
                                if (*(int *)options - 1U < 2) goto LAB_0037d283;
                                pcVar3 = "Unexpected subjectUniqueId (must be V2 or V3 certificate)"
                                ;
                              }
                            }
                            else {
LAB_0037d283:
                              bVar1 = der::Parser::ReadOptionalTag
                                                (&tbs_parser,0xa0000003,
                                                 (optional<bssl::der::Input> *)(options + 0xa8));
                              pcVar3 = "Failed reading extensions SEQUENCE";
                              if (bVar1) {
                                if (options[0xb8].allow_invalid_serial_numbers == true) {
                                  pIVar2 = ::std::optional<bssl::der::Input>::value
                                                     ((optional<bssl::der::Input> *)(options + 0xa8)
                                                     );
                                  input_00.data_.size_ = extraout_RDX;
                                  input_00.data_.data_ = (uchar *)(pIVar2->data_).size_;
                                  bVar1 = anon_unknown_0::IsSequenceTLV
                                                    ((anon_unknown_0 *)(pIVar2->data_).data_,
                                                     input_00);
                                  if (bVar1) {
                                    if (*(int *)options == 2) goto LAB_0037d2d9;
                                    pcVar3 = "Unexpected extensions (must be V3 certificate)";
                                  }
                                }
                                else {
LAB_0037d2d9:
                                  bVar1 = der::Parser::HasMore(&tbs_parser);
                                  if (!bVar1) {
                                    bVar1 = der::Parser::HasMore(&parser);
                                    bVar1 = !bVar1;
                                    goto LAB_0037d32b;
                                  }
                                  pcVar3 = "Unconsumed data inside TBSCertificate";
                                }
                              }
                            }
                          }
                          else {
                            pcVar3 = "Failed reading subjectUniqueId";
                          }
                          CertErrors::AddError((CertErrors *)out,pcVar3);
                          goto LAB_0037d329;
                        }
                        in.data_.size_ = (size_t)not_before;
                        in.data_.data_ =
                             (uchar *)issuer_unique_id.
                                      super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
                                      super__Optional_payload_base<bssl::der::Input>._M_payload.
                                      _M_value.data_.size_;
                        der::ParseBitString((optional<bssl::der::BitString> *)&parser_1,
                                            (der *)issuer_unique_id.
                                                                                                      
                                                  super__Optional_base<bssl::der::Input,_true,_true>
                                                  ._M_payload.
                                                  super__Optional_payload_base<bssl::der::Input>.
                                                  _M_payload._M_value.data_.data_,in);
                        *(size_t *)(options + 0x78) = parser_1.advance_len_;
                        *(undefined8 *)(options + 0x80) = uStack_c8;
                        *(uint8_t **)(options + 0x68) = parser_1.cbs_.data;
                        *(size_t *)(options + 0x70) = parser_1.cbs_.len;
                        if (options[0x80].allow_invalid_serial_numbers == false) {
                          pcVar3 = "Failed parsing issuerUniqueId";
                        }
                        else {
                          if (*(int *)options - 1U < 2) goto LAB_0037d214;
                          pcVar3 = "Unexpected issuerUniqueId (must be V2 or V3 certificate)";
                        }
                      }
                      else {
                        pcVar3 = "Failed reading issuerUniqueId";
                      }
                      CertErrors::AddError((CertErrors *)out,pcVar3);
                      goto LAB_0037d329;
                    }
                    pcVar3 = "Failed reading subjectPublicKeyInfo";
                  }
                  else {
                    pcVar3 = "Failed reading subject";
                  }
                }
                else {
                  pcVar3 = "Failed parsing validity";
                }
              }
              else {
                pcVar3 = "Failed reading validity";
              }
              CertErrors::AddError((CertErrors *)out,pcVar3);
              goto LAB_0037d329;
            }
            pcVar3 = "Failed reading issuer";
          }
          else {
            pcVar3 = "Failed reading signature";
          }
        }
        else {
          pcVar3 = "Failed reading serialNumber";
        }
      }
    }
    else {
      pcVar3 = "Failed reading version";
    }
LAB_0037d321:
    CertErrors::AddError((CertErrors *)out,pcVar3);
  }
  else {
    CertErrors::AddError((CertErrors *)out,"Failed parsing TBSCertificate SEQUENCE");
  }
LAB_0037d329:
  bVar1 = false;
LAB_0037d32b:
  CertErrors::~CertErrors(&unused_errors);
  return bVar1;
}

Assistant:

bool ParseTbsCertificate(der::Input tbs_tlv,
                         const ParseCertificateOptions &options,
                         ParsedTbsCertificate *out, CertErrors *errors) {
  // The rest of this function assumes that |errors| is non-null.
  CertErrors unused_errors;
  if (!errors) {
    errors = &unused_errors;
  }

  // TODO(crbug.com/634443): Add useful error information to |errors|.

  der::Parser parser(tbs_tlv);

  //   TBSCertificate  ::=  SEQUENCE  {
  der::Parser tbs_parser;
  if (!parser.ReadSequence(&tbs_parser)) {
    errors->AddError(kTbsNotSequence);
    return false;
  }

  //        version         [0]  EXPLICIT Version DEFAULT v1,
  std::optional<der::Input> version;
  if (!tbs_parser.ReadOptionalTag(
          CBS_ASN1_CONTEXT_SPECIFIC | CBS_ASN1_CONSTRUCTED | 0, &version)) {
    errors->AddError(kFailedReadingVersion);
    return false;
  }
  if (version) {
    if (!ParseVersion(version.value(), &out->version)) {
      errors->AddError(kFailedParsingVersion);
      return false;
    }
    if (out->version == CertificateVersion::V1) {
      errors->AddError(kVersionExplicitlyV1);
      // The correct way to specify v1 is to omit the version field since v1 is
      // the DEFAULT.
      return false;
    }
  } else {
    out->version = CertificateVersion::V1;
  }

  //        serialNumber         CertificateSerialNumber,
  if (!tbs_parser.ReadTag(CBS_ASN1_INTEGER, &out->serial_number)) {
    errors->AddError(kFailedReadingSerialNumber);
    return false;
  }
  if (!VerifySerialNumber(out->serial_number,
                          options.allow_invalid_serial_numbers, errors)) {
    // Invalid serial numbers are only considered fatal failures if
    // |!allow_invalid_serial_numbers|.
    if (!options.allow_invalid_serial_numbers) {
      return false;
    }
  }

  //        signature            AlgorithmIdentifier,
  if (!ReadSequenceTLV(&tbs_parser, &out->signature_algorithm_tlv)) {
    errors->AddError(kFailedReadingSignatureValue);
    return false;
  }

  //        issuer               Name,
  if (!ReadSequenceTLV(&tbs_parser, &out->issuer_tlv)) {
    errors->AddError(kFailedReadingIssuer);
    return false;
  }

  //        validity             Validity,
  der::Input validity_tlv;
  if (!tbs_parser.ReadRawTLV(&validity_tlv)) {
    errors->AddError(kFailedReadingValidity);
    return false;
  }
  if (!ParseValidity(validity_tlv, &out->validity_not_before,
                     &out->validity_not_after)) {
    errors->AddError(kFailedParsingValidity);
    return false;
  }

  //        subject              Name,
  if (!ReadSequenceTLV(&tbs_parser, &out->subject_tlv)) {
    errors->AddError(kFailedReadingSubject);
    return false;
  }

  //        subjectPublicKeyInfo SubjectPublicKeyInfo,
  if (!ReadSequenceTLV(&tbs_parser, &out->spki_tlv)) {
    errors->AddError(kFailedReadingSpki);
    return false;
  }

  //        issuerUniqueID  [1]  IMPLICIT UniqueIdentifier OPTIONAL,
  //                             -- If present, version MUST be v2 or v3
  std::optional<der::Input> issuer_unique_id;
  if (!tbs_parser.ReadOptionalTag(CBS_ASN1_CONTEXT_SPECIFIC | 1,
                                  &issuer_unique_id)) {
    errors->AddError(kFailedReadingIssuerUniqueId);
    return false;
  }
  if (issuer_unique_id) {
    out->issuer_unique_id = der::ParseBitString(issuer_unique_id.value());
    if (!out->issuer_unique_id) {
      errors->AddError(kFailedParsingIssuerUniqueId);
      return false;
    }
    if (out->version != CertificateVersion::V2 &&
        out->version != CertificateVersion::V3) {
      errors->AddError(kIssuerUniqueIdNotExpected);
      return false;
    }
  }

  //        subjectUniqueID [2]  IMPLICIT UniqueIdentifier OPTIONAL,
  //                             -- If present, version MUST be v2 or v3
  std::optional<der::Input> subject_unique_id;
  if (!tbs_parser.ReadOptionalTag(CBS_ASN1_CONTEXT_SPECIFIC | 2,
                                  &subject_unique_id)) {
    errors->AddError(kFailedReadingSubjectUniqueId);
    return false;
  }
  if (subject_unique_id) {
    out->subject_unique_id = der::ParseBitString(subject_unique_id.value());
    if (!out->subject_unique_id) {
      errors->AddError(kFailedParsingSubjectUniqueId);
      return false;
    }
    if (out->version != CertificateVersion::V2 &&
        out->version != CertificateVersion::V3) {
      errors->AddError(kSubjectUniqueIdNotExpected);
      return false;
    }
  }

  //        extensions      [3]  EXPLICIT Extensions OPTIONAL
  //                             -- If present, version MUST be v3
  if (!tbs_parser.ReadOptionalTag(
          CBS_ASN1_CONTEXT_SPECIFIC | CBS_ASN1_CONSTRUCTED | 3,
          &out->extensions_tlv)) {
    errors->AddError(kFailedReadingExtensions);
    return false;
  }
  if (out->extensions_tlv) {
    // extensions_tlv must be a single element. Also check that it is a
    // SEQUENCE.
    if (!IsSequenceTLV(out->extensions_tlv.value())) {
      errors->AddError(kFailedReadingExtensions);
      return false;
    }
    if (out->version != CertificateVersion::V3) {
      errors->AddError(kUnexpectedExtensions);
      return false;
    }
  }

  // Note that there IS an extension point at the end of TBSCertificate
  // (according to RFC 5912), so from that interpretation, unconsumed data would
  // be allowed in |tbs_parser|.
  //
  // However because only v1, v2, and v3 certificates are supported by the
  // parsing, there shouldn't be any subsequent data in those versions, so
  // reject.
  if (tbs_parser.HasMore()) {
    errors->AddError(kUnconsumedDataInsideTbsCertificateSequence);
    return false;
  }

  // By definition the input was a single TBSCertificate, so there shouldn't be
  // unconsumed data.
  if (parser.HasMore()) {
    return false;
  }

  return true;
}